

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O0

void http_parser_init(http_parser *parser,http_parser_type t)

{
  void *pvVar1;
  int local_24;
  void *data;
  http_parser_type t_local;
  http_parser *parser_local;
  
  pvVar1 = parser->data;
  memset(parser,0,0x20);
  parser->data = pvVar1;
  *(http_parser_type *)parser =
       *(http_parser_type *)parser & ~(HTTP_BOTH|HTTP_RESPONSE) | t & (HTTP_BOTH|HTTP_RESPONSE);
  if (t == HTTP_REQUEST) {
    local_24 = 0x12;
  }
  else {
    local_24 = 2;
    if (t == HTTP_RESPONSE) {
      local_24 = 4;
    }
  }
  *(uint *)parser = *(uint *)parser & 0xffff00ff | local_24 << 8;
  *(uint *)&parser->field_0x14 = *(uint *)&parser->field_0x14 & 0x80ffffff;
  return;
}

Assistant:

void
http_parser_init (http_parser *parser, enum http_parser_type t)
{
  void *data = parser->data; /* preserve application data */
  memset(parser, 0, sizeof(*parser));
  parser->data = data;
  parser->type = t;
  parser->state = (t == HTTP_REQUEST ? s_start_req : (t == HTTP_RESPONSE ? s_start_res : s_start_req_or_res));
  parser->http_errno = HPE_OK;
}